

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O1

bool __thiscall GameBoard::typeCountError(GameBoard *this,int color)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  iVar2 = 10000000;
  iVar3 = -1;
  lVar4 = 0;
  do {
    iVar1 = this->typeCountForColor[color][lVar4];
    if (iVar1 < iVar2) {
      iVar2 = iVar1;
    }
    if (iVar1 < iVar3) {
      iVar1 = iVar3;
    }
    iVar3 = iVar1;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 7);
  return 2 < iVar3 - iVar2;
}

Assistant:

bool GameBoard::typeCountError(int color)
{
    int mn = 1e7, mx = -1;
    for (int i = 0; i < 7; ++i) {
        mn = min(mn, typeCountForColor[color][i]);
        mx = max(mx, typeCountForColor[color][i]);
    }
    return mx - mn > 2;
}